

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

ModelPtr __thiscall libcellml::AnyCellmlElement::model(AnyCellmlElement *this)

{
  AnyCellmlElementImpl *pAVar1;
  undefined8 *puVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined8 *in_RSI;
  ModelPtr MVar3;
  
  if ((*(uint *)*in_RSI | 4) == 7) {
    puVar2 = (undefined8 *)
             std::__any_caster<std::shared_ptr<libcellml::Model>>((any *)((uint *)*in_RSI + 2));
    if (puVar2 == (undefined8 *)0x0) {
      std::__throw_bad_any_cast();
    }
    this->mPimpl = (AnyCellmlElementImpl *)*puVar2;
    pAVar1 = (AnyCellmlElementImpl *)puVar2[1];
    this[1].mPimpl = pAVar1;
    in_RDX._M_pi = extraout_RDX;
    if (pAVar1 != (AnyCellmlElementImpl *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(pAVar1->mItem)._M_manager = *(int *)&(pAVar1->mItem)._M_manager + 1;
        UNLOCK();
      }
      else {
        *(int *)&(pAVar1->mItem)._M_manager = *(int *)&(pAVar1->mItem)._M_manager + 1;
      }
    }
  }
  else {
    this->mPimpl = (AnyCellmlElementImpl *)0x0;
    this[1].mPimpl = (AnyCellmlElementImpl *)0x0;
  }
  MVar3.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  MVar3.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ModelPtr)MVar3.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ModelPtr AnyCellmlElement::model() const
{
    if ((mPimpl->mType == CellmlElementType::ENCAPSULATION)
        || (mPimpl->mType == CellmlElementType::MODEL)) {
        try {
            return std::any_cast<ModelPtr>(mPimpl->mItem);
        } catch (const std::bad_any_cast &) {
            return nullptr;
        }
    }

    return nullptr;
}